

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBAddRow_C(uint8 *src_argb0,uint8 *src_argb1,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint8 uVar10;
  
  if (0 < width) {
    lVar9 = 0;
    do {
      bVar1 = src_argb0[lVar9 * 4 + 1];
      bVar2 = src_argb0[lVar9 * 4 + 2];
      bVar3 = src_argb0[lVar9 * 4 + 3];
      bVar4 = src_argb1[lVar9 * 4 + 1];
      bVar5 = src_argb1[lVar9 * 4 + 2];
      bVar6 = src_argb1[lVar9 * 4 + 3];
      uVar10 = (uint8)((uint)src_argb1[lVar9 * 4] + (uint)src_argb0[lVar9 * 4]);
      if (0xfe < (uint)src_argb1[lVar9 * 4] + (uint)src_argb0[lVar9 * 4]) {
        uVar10 = 0xff;
      }
      dst_argb[lVar9 * 4] = uVar10;
      uVar10 = (uint8)((uint)bVar4 + (uint)bVar1);
      if (0xfe < (uint)bVar4 + (uint)bVar1) {
        uVar10 = 0xff;
      }
      dst_argb[lVar9 * 4 + 1] = uVar10;
      uVar7 = (uint)bVar5 + (uint)bVar2;
      if (0xfe < (uint)bVar5 + (uint)bVar2) {
        uVar7 = 0xff;
      }
      uVar8 = (uint)bVar6 + (uint)bVar3;
      if (0xfe < (uint)bVar6 + (uint)bVar3) {
        uVar8 = 0xff;
      }
      dst_argb[lVar9 * 4 + 2] = (uint8)uVar7;
      dst_argb[lVar9 * 4 + 3] = (uint8)uVar8;
      lVar9 = lVar9 + 1;
    } while (width != (int)lVar9);
  }
  return;
}

Assistant:

void ARGBAddRow_C(const uint8* src_argb0,
                  const uint8* src_argb1,
                  uint8* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_add = src_argb1[0];
    const int g_add = src_argb1[1];
    const int r_add = src_argb1[2];
    const int a_add = src_argb1[3];
    dst_argb[0] = SHADE(b, b_add);
    dst_argb[1] = SHADE(g, g_add);
    dst_argb[2] = SHADE(r, r_add);
    dst_argb[3] = SHADE(a, a_add);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}